

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  TimingCheckEventArgSyntax *pTVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  TimingCheckEventConditionSyntax *local_38;
  EdgeControlSpecifierSyntax *local_30;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x28) == (SyntaxNode *)0x0) {
    local_30 = (EdgeControlSpecifierSyntax *)0x0;
  }
  else {
    local_30 = (EdgeControlSpecifierSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_38,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_38 = (TimingCheckEventConditionSyntax *)0x0;
  }
  else {
    local_38 = (TimingCheckEventConditionSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TimingCheckEventArgSyntax,slang::parsing::Token,slang::syntax::EdgeControlSpecifierSyntax*,slang::syntax::ExpressionSyntax&,slang::syntax::TimingCheckEventConditionSyntax*>
                     ((BumpAllocator *)__child_stack,&local_28,&local_30,(ExpressionSyntax *)args_2,
                      &local_38);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TimingCheckEventArgSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TimingCheckEventArgSyntax>(
        node.edge.deepClone(alloc),
        node.controlSpecifier ? deepClone(*node.controlSpecifier, alloc) : nullptr,
        *deepClone<ExpressionSyntax>(*node.terminal, alloc),
        node.condition ? deepClone(*node.condition, alloc) : nullptr
    );
}